

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaExporter::WriteTextureColorEntry
          (ColladaExporter *this,Surface *pSurface,string *pTypeName,string *pImageName)

{
  undefined1 *puVar1;
  string *psVar2;
  string *psVar3;
  size_type sVar4;
  ostream *poVar5;
  string local_50;
  
  if (pSurface->exist == true) {
    puVar1 = &this->field_0x38;
    psVar2 = &this->startstr;
    poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar5 = std::operator<<(poVar5,"<");
    poVar5 = std::operator<<(poVar5,(string *)pTypeName);
    poVar5 = std::operator<<(poVar5,">");
    psVar3 = &this->endstr;
    std::operator<<(poVar5,(string *)psVar3);
    PushTag(this);
    sVar4 = (pSurface->texture)._M_string_length;
    poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    if (sVar4 == 0) {
      poVar5 = std::operator<<(poVar5,"<color sid=\"");
      poVar5 = std::operator<<(poVar5,(string *)pTypeName);
      poVar5 = std::operator<<(poVar5,"\">");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pSurface->color).r);
      poVar5 = std::operator<<(poVar5,"   ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pSurface->color).g);
      poVar5 = std::operator<<(poVar5,"   ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pSurface->color).b);
      poVar5 = std::operator<<(poVar5,"   ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(pSurface->color).a);
      poVar5 = std::operator<<(poVar5,"</color>");
      std::operator<<(poVar5,(string *)psVar3);
    }
    else {
      poVar5 = std::operator<<(poVar5,"<texture texture=\"");
      XMLIDEncode(&local_50,pImageName);
      poVar5 = std::operator<<(poVar5,(string *)&local_50);
      poVar5 = std::operator<<(poVar5,"\" texcoord=\"CHANNEL");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,"\" />");
      std::operator<<(poVar5,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_50);
    }
    PopTag(this);
    poVar5 = std::operator<<((ostream *)puVar1,(string *)psVar2);
    poVar5 = std::operator<<(poVar5,"</");
    poVar5 = std::operator<<(poVar5,(string *)pTypeName);
    poVar5 = std::operator<<(poVar5,">");
    std::operator<<(poVar5,(string *)psVar3);
  }
  return;
}

Assistant:

void ColladaExporter::WriteTextureColorEntry( const Surface& pSurface, const std::string& pTypeName, const std::string& pImageName)
{
  if(pSurface.exist) {
    mOutput << startstr << "<" << pTypeName << ">" << endstr;
    PushTag();
    if( pSurface.texture.empty() )
    {
      mOutput << startstr << "<color sid=\"" << pTypeName << "\">" << pSurface.color.r << "   " << pSurface.color.g << "   " << pSurface.color.b << "   " << pSurface.color.a << "</color>" << endstr;
    }
    else
    {
      mOutput << startstr << "<texture texture=\"" << XMLIDEncode(pImageName) << "\" texcoord=\"CHANNEL" << pSurface.channel << "\" />" << endstr;
    }
    PopTag();
    mOutput << startstr << "</" << pTypeName << ">" << endstr;
  }
}